

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O0

uint32_t ndn_signature_info_probe_block_size(ndn_signature_t *signature)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t validity_period_buffer_size;
  uint32_t key_name_block_size;
  uint32_t info_buffer_size;
  ndn_signature_t *signature_local;
  
  validity_period_buffer_size = encoder_probe_block_size(0x1b,1);
  if (signature->enable_KeyLocator != '\0') {
    uVar1 = ndn_name_probe_block_size(&signature->key_locator_name);
    uVar1 = encoder_probe_block_size(0x1c,uVar1);
    validity_period_buffer_size = uVar1 + validity_period_buffer_size;
  }
  if (signature->enable_ValidityPeriod != '\0') {
    uVar1 = encoder_probe_block_size(0xfe,0xf);
    uVar2 = encoder_probe_block_size(0xff,0xf);
    uVar1 = encoder_probe_block_size(0xfd,uVar2 + uVar1);
    validity_period_buffer_size = uVar1 + validity_period_buffer_size;
  }
  if (signature->enable_SignatureNonce != '\0') {
    uVar1 = encoder_probe_block_size(0x26,4);
    validity_period_buffer_size = uVar1 + validity_period_buffer_size;
  }
  if (signature->enable_Timestamp != '\0') {
    uVar1 = encoder_probe_uint_length(signature->timestamp);
    uVar1 = encoder_probe_block_size(0x28,uVar1);
    validity_period_buffer_size = uVar1 + validity_period_buffer_size;
  }
  if (signature->enable_Seqnum != '\0') {
    uVar1 = encoder_probe_uint_length(signature->seqnum);
    uVar1 = encoder_probe_block_size(0x2a,uVar1);
    validity_period_buffer_size = uVar1 + validity_period_buffer_size;
  }
  if ((signature->is_interest & 1U) == 0) {
    signature_local._4_4_ = encoder_probe_block_size(0x16,validity_period_buffer_size);
  }
  else {
    signature_local._4_4_ = encoder_probe_block_size(0x2c,validity_period_buffer_size);
  }
  return signature_local._4_4_;
}

Assistant:

static inline uint32_t
ndn_signature_info_probe_block_size(const ndn_signature_t* signature)
{
  // signature type
  uint32_t info_buffer_size = encoder_probe_block_size(TLV_SignatureType, 1);

  if (signature->enable_KeyLocator > 0) {
    uint32_t key_name_block_size = ndn_name_probe_block_size(&signature->key_locator_name);
    info_buffer_size += encoder_probe_block_size(TLV_KeyLocator, key_name_block_size);
  }
  if (signature->enable_ValidityPeriod > 0) {
    uint32_t validity_period_buffer_size = encoder_probe_block_size(TLV_NotBefore, 15);
    validity_period_buffer_size += encoder_probe_block_size(TLV_NotAfter, 15);
    info_buffer_size += encoder_probe_block_size(TLV_ValidityPeriod, validity_period_buffer_size);
  }
  if (signature->enable_SignatureNonce > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_SignatureNonce, 4);
  }
  if (signature->enable_Timestamp > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_Timestamp,
                                                 encoder_probe_uint_length(signature->timestamp));
  }
  if (signature->enable_Seqnum > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_SeqNum,
                                                 encoder_probe_uint_length(signature->seqnum));
  }
  if (signature->is_interest)
    return encoder_probe_block_size(TLV_InterestSignatureInfo, info_buffer_size);
  else
    return encoder_probe_block_size(TLV_SignatureInfo, info_buffer_size);
}